

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type __thiscall QList<QTreeWidgetItem_*>::takeFirst(QList<QTreeWidgetItem_*> *this)

{
  QTreeWidgetItem ***pppQVar1;
  qsizetype *pqVar2;
  QTreeWidgetItem *pQVar3;
  iterator iVar4;
  
  iVar4 = begin(this);
  pQVar3 = *iVar4.i;
  pppQVar1 = &(this->d).ptr;
  *pppQVar1 = *pppQVar1 + 1;
  pqVar2 = &(this->d).size;
  *pqVar2 = *pqVar2 + -1;
  return pQVar3;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }